

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioport.c
# Opt level: O3

uint8_t cpu_inb_x86_64(uc_struct_conflict *uc,uint32_t addr)

{
  list_item *plVar1;
  void *pvVar2;
  list_item **pplVar3;
  uint8_t uVar4;
  list_item *plVar5;
  undefined8 in_R9;
  
  plVar1 = uc->hook[1].head;
  plVar5 = plVar1;
  if (plVar1 == (list_item *)0x0) {
    return '\0';
  }
  while( true ) {
    pvVar2 = plVar5->data;
    if (pvVar2 == (void *)0x0) {
      return '\0';
    }
    if ((*(char *)((long)pvVar2 + 0x14) == '\0') && (*(int *)((long)pvVar2 + 4) == 0xda)) break;
    pplVar3 = &plVar5->next;
    plVar5 = *pplVar3;
    if (*pplVar3 == (list_item *)0x0) {
      return '\0';
    }
  }
  uVar4 = (**(code **)((long)pvVar2 + 0x28))
                    (uc,addr,1,*(undefined8 *)((long)pvVar2 + 0x30),pvVar2,in_R9,plVar1);
  return uVar4;
}

Assistant:

uint8_t cpu_inb(struct uc_struct *uc, uint32_t addr)
{
    // uint8_t val;

    // address_space_read(&uc->address_space_io, addr, MEMTXATTRS_UNSPECIFIED,
    //                    &val, 1);

    //LOG_IOPORT("inb : %04"FMT_pioaddr" %02"PRIx8"\n", addr, val);
    // Unicorn: call registered IN callbacks
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (hook->insn == UC_X86_INS_IN)
            return ((uc_cb_insn_in_t)hook->callback)(uc, addr, 1, hook->user_data);
    }

    return 0;
}